

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::writeSortKey
          (RuleBasedCollator *this,UChar *s,int32_t length,SortKeyByteSink *sink,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UChar *local_418;
  undefined1 local_408 [8];
  FCDUTF16CollationIterator iter_1;
  UTF16CollationIterator iter;
  LevelCallback local_48;
  LevelCallback callback;
  UBool numeric;
  UChar *limit;
  UErrorCode *errorCode_local;
  SortKeyByteSink *sink_local;
  int32_t length_local;
  UChar *s_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (length < 0) {
      local_418 = (UChar *)0x0;
    }
    else {
      local_418 = s + length;
    }
    callback._vptr_LevelCallback._7_1_ = CollationSettings::isNumeric(this->settings);
    CollationKeys::LevelCallback::LevelCallback(&local_48);
    UVar1 = CollationSettings::dontCheckFCD(this->settings);
    if (UVar1 == '\0') {
      FCDUTF16CollationIterator::FCDUTF16CollationIterator
                ((FCDUTF16CollationIterator *)local_408,this->data,
                 callback._vptr_LevelCallback._7_1_,s,s,local_418);
      CollationKeys::writeSortKeyUpToQuaternary
                ((CollationIterator *)local_408,this->data->compressibleBytes,this->settings,sink,
                 PRIMARY_LEVEL,&local_48,'\x01',errorCode);
      FCDUTF16CollationIterator::~FCDUTF16CollationIterator((FCDUTF16CollationIterator *)local_408);
    }
    else {
      UTF16CollationIterator::UTF16CollationIterator
                ((UTF16CollationIterator *)&iter_1.checkDir,this->data,
                 callback._vptr_LevelCallback._7_1_,s,s,local_418);
      CollationKeys::writeSortKeyUpToQuaternary
                ((CollationIterator *)&iter_1.checkDir,this->data->compressibleBytes,this->settings,
                 sink,PRIMARY_LEVEL,&local_48,'\x01',errorCode);
      UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)&iter_1.checkDir);
    }
    iVar2 = CollationSettings::getStrength(this->settings);
    if (iVar2 == 0xf) {
      writeIdenticalLevel(this,s,local_418,sink,errorCode);
    }
    (*(sink->super_ByteSink)._vptr_ByteSink[2])(sink,"",1);
    CollationKeys::LevelCallback::~LevelCallback(&local_48);
  }
  return;
}

Assistant:

void
RuleBasedCollator::writeSortKey(const UChar *s, int32_t length,
                                SortKeyByteSink &sink, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return; }
    const UChar *limit = (length >= 0) ? s + length : NULL;
    UBool numeric = settings->isNumeric();
    CollationKeys::LevelCallback callback;
    if(settings->dontCheckFCD()) {
        UTF16CollationIterator iter(data, numeric, s, s, limit);
        CollationKeys::writeSortKeyUpToQuaternary(iter, data->compressibleBytes, *settings,
                                                  sink, Collation::PRIMARY_LEVEL,
                                                  callback, TRUE, errorCode);
    } else {
        FCDUTF16CollationIterator iter(data, numeric, s, s, limit);
        CollationKeys::writeSortKeyUpToQuaternary(iter, data->compressibleBytes, *settings,
                                                  sink, Collation::PRIMARY_LEVEL,
                                                  callback, TRUE, errorCode);
    }
    if(settings->getStrength() == UCOL_IDENTICAL) {
        writeIdenticalLevel(s, limit, sink, errorCode);
    }
    static const char terminator = 0;  // TERMINATOR_BYTE
    sink.Append(&terminator, 1);
}